

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

jpc_ms_t * jpc_ms_create(int type)

{
  int *piVar1;
  jpc_ms_t *pjVar2;
  _func_void_jp2_box_t_ptr **pp_Var3;
  
  pjVar2 = (jpc_ms_t *)jas_malloc(0x88);
  if (pjVar2 != (jpc_ms_t *)0x0) {
    pjVar2->id = (long)type;
    pjVar2->len = 0;
    pp_Var3 = &jp2_boxinfos[0x13].ops.destroy;
    do {
      piVar1 = (int *)(pp_Var3 + 4);
      pp_Var3 = pp_Var3 + 6;
      if (*piVar1 == type) break;
    } while (-1 < *piVar1);
    pjVar2->ops = (jpc_msops_s *)pp_Var3;
    (pjVar2->parms).sot.tileno = 0;
    (pjVar2->parms).sot.len = 0;
    (pjVar2->parms).siz.height = 0;
    (pjVar2->parms).siz.xoff = 0;
    (pjVar2->parms).siz.yoff = 0;
    (pjVar2->parms).siz.tilewidth = 0;
    (pjVar2->parms).siz.tileheight = 0;
    (pjVar2->parms).siz.tilexoff = 0;
    (pjVar2->parms).siz.tileyoff = 0;
    (pjVar2->parms).siz.numcomps = 0;
    (pjVar2->parms).siz.comps = (jpc_sizcomp_t *)0x0;
    *(undefined8 *)((long)&pjVar2->parms + 0x58) = 0;
    *(undefined8 *)((long)&pjVar2->parms + 0x60) = 0;
  }
  return pjVar2;
}

Assistant:

jpc_ms_t *jpc_ms_create(int type)
{
	jpc_ms_t *ms;
	const jpc_mstabent_t *mstabent;

	if (!(ms = jas_malloc(sizeof(jpc_ms_t)))) {
		return 0;
	}
	ms->id = type;
	ms->len = 0;
	mstabent = jpc_mstab_lookup(ms->id);
	ms->ops = &mstabent->ops;
	memset(&ms->parms, 0, sizeof(jpc_msparms_t));
	return ms;
}